

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.c
# Opt level: O0

int lws_callback_http(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  int iVar1;
  uchar *puVar2;
  lws_token_indexes local_44c;
  int hlen;
  int n;
  char buf [1024];
  uchar *c;
  size_t len_local;
  void *in_local;
  void *user_local;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  
  local_44c = WSI_TOKEN_GET_URI;
  if (reason == LWS_CALLBACK_HTTP) {
    do {
      puVar2 = lws_token_to_string(local_44c);
      if (((puVar2 != (uchar *)0x0) && (iVar1 = lws_hdr_total_length(wsi,local_44c), iVar1 != 0)) &&
         (iVar1 < 0x400)) {
        iVar1 = lws_hdr_copy(wsi,(char *)&hlen,0x400,local_44c);
        if (iVar1 < 0) {
          fprintf(_stderr,"    %s (too big)\n",puVar2);
        }
        else {
          buf[0x3f7] = '\0';
          fprintf(_stderr,"    %s = %s\n",puVar2,&hlen);
        }
      }
      local_44c = local_44c + WSI_TOKEN_POST_URI;
    } while (puVar2 != (uchar *)0x0);
    local_44c = 0;
    while (iVar1 = lws_hdr_copy_fragment(wsi,(char *)&hlen,0x400,WSI_TOKEN_HTTP_URI_ARGS,local_44c),
          0 < iVar1) {
      local_44c = local_44c + 1;
      _lws_log(4,"URI Arg %d: %s\n",(ulong)local_44c,&hlen);
    }
    iVar1 = lws_return_http_status(wsi,0x194,(char *)0x0);
    if (iVar1 == 0) {
      iVar1 = lws_http_transaction_completed(wsi);
      if (iVar1 == 0) {
        wsi_local._4_4_ = 0;
      }
      else {
        wsi_local._4_4_ = -1;
      }
    }
    else {
      wsi_local._4_4_ = -1;
    }
  }
  else {
    wsi_local._4_4_ = lws_callback_http_dummy(wsi,reason,user,in,len);
  }
  return wsi_local._4_4_;
}

Assistant:

static int
lws_callback_http(struct lws *wsi, enum lws_callback_reasons reason, void *user,
		  void *in, size_t len)
{
	const unsigned char *c;
	char buf[1024];
	int n = 0, hlen;

	switch (reason) {
	case LWS_CALLBACK_HTTP:

		/* non-mount-handled accesses will turn up here */

		/* dump the headers */

		do {
			c = lws_token_to_string(n);
			if (!c) {
				n++;
				continue;
			}

			hlen = lws_hdr_total_length(wsi, n);
			if (!hlen || hlen > (int)sizeof(buf) - 1) {
				n++;
				continue;
			}

			if (lws_hdr_copy(wsi, buf, sizeof buf, n) < 0)
				fprintf(stderr, "    %s (too big)\n", (char *)c);
			else {
				buf[sizeof(buf) - 1] = '\0';

				fprintf(stderr, "    %s = %s\n", (char *)c, buf);
			}
			n++;
		} while (c);

		/* dump the individual URI Arg parameters */

		n = 0;
		while (lws_hdr_copy_fragment(wsi, buf, sizeof(buf),
					     WSI_TOKEN_HTTP_URI_ARGS, n) > 0) {
			lwsl_notice("URI Arg %d: %s\n", ++n, buf);
		}

		if (lws_return_http_status(wsi, HTTP_STATUS_NOT_FOUND, NULL))
			return -1;

		if (lws_http_transaction_completed(wsi))
			return -1;

		return 0;
	default:
		break;
	}

	return lws_callback_http_dummy(wsi, reason, user, in, len);
}